

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDeformer.cpp
# Opt level: O3

void __thiscall
Assimp::FBX::Skin::Skin(Skin *this,uint64_t id,Element *element,Document *doc,string *name)

{
  pointer *pppCVar1;
  iterator __position;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
  *this_00;
  const_iterator cVar2;
  Token *t;
  _Alloc_hider _Var3;
  Element *el;
  float fVar4;
  Cluster *cluster;
  key_type local_58;
  Cluster *local_38;
  
  Deformer::Deformer(&this->super_Deformer,id,element,doc,name);
  (this->super_Deformer).super_Object._vptr_Object = (_func_int **)&PTR__Skin_0025d058;
  this->accuracy = 0.0;
  (this->clusters).
  super__Vector_base<const_Assimp::FBX::Cluster_*,_std::allocator<const_Assimp::FBX::Cluster_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->clusters).
  super__Vector_base<const_Assimp::FBX::Cluster_*,_std::allocator<const_Assimp::FBX::Cluster_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->clusters).
  super__Vector_base<const_Assimp::FBX::Cluster_*,_std::allocator<const_Assimp::FBX::Cluster_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
             *)GetRequiredScope(element);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Link_DeformAcuracy","");
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
          ::find(this_00,&local_58);
  if ((_Rb_tree_header *)cVar2._M_node == &(this_00->_M_impl).super__Rb_tree_header) {
    el = (Element *)0x0;
  }
  else {
    el = *(Element **)(cVar2._M_node + 2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if (el != (Element *)0x0) {
    t = GetRequiredToken(el,0);
    fVar4 = ParseTokenAsFloat(t);
    this->accuracy = fVar4;
  }
  Document::GetConnectionsByDestinationSequenced
            ((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
              *)&local_58,doc,(this->super_Deformer).super_Object.id,"Deformer");
  std::vector<const_Assimp::FBX::Cluster_*,_std::allocator<const_Assimp::FBX::Cluster_*>_>::reserve
            (&this->clusters,
             (long)(local_58._M_string_length - (long)local_58._M_dataplus._M_p) >> 3);
  if (local_58._M_dataplus._M_p != (pointer)local_58._M_string_length) {
    _Var3._M_p = local_58._M_dataplus._M_p;
    do {
      local_38 = Util::ProcessSimpleConnection<Assimp::FBX::Cluster>
                           (*(Connection **)_Var3._M_p,false,"Cluster -> Skin",element,(char **)0x0)
      ;
      if (local_38 != (Cluster *)0x0) {
        __position._M_current =
             (this->clusters).
             super__Vector_base<const_Assimp::FBX::Cluster_*,_std::allocator<const_Assimp::FBX::Cluster_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->clusters).
            super__Vector_base<const_Assimp::FBX::Cluster_*,_std::allocator<const_Assimp::FBX::Cluster_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<Assimp::FBX::Cluster_const*,std::allocator<Assimp::FBX::Cluster_const*>>::
          _M_realloc_insert<Assimp::FBX::Cluster_const*const&>
                    ((vector<Assimp::FBX::Cluster_const*,std::allocator<Assimp::FBX::Cluster_const*>>
                      *)&this->clusters,__position,&local_38);
        }
        else {
          *__position._M_current = local_38;
          pppCVar1 = &(this->clusters).
                      super__Vector_base<const_Assimp::FBX::Cluster_*,_std::allocator<const_Assimp::FBX::Cluster_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppCVar1 = *pppCVar1 + 1;
        }
      }
      _Var3._M_p = _Var3._M_p + 8;
    } while (_Var3._M_p != (pointer)local_58._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return;
}

Assistant:

Skin::Skin(uint64_t id, const Element& element, const Document& doc, const std::string& name)
: Deformer(id,element,doc,name)
, accuracy( 0.0f ) {
    const Scope& sc = GetRequiredScope(element);

    const Element* const Link_DeformAcuracy = sc["Link_DeformAcuracy"];
    if(Link_DeformAcuracy) {
        accuracy = ParseTokenAsFloat(GetRequiredToken(*Link_DeformAcuracy,0));
    }

    // resolve assigned clusters
    const std::vector<const Connection*>& conns = doc.GetConnectionsByDestinationSequenced(ID(),"Deformer");

    clusters.reserve(conns.size());
    for(const Connection* con : conns) {

        const Cluster* const cluster = ProcessSimpleConnection<Cluster>(*con, false, "Cluster -> Skin", element);
        if(cluster) {
            clusters.push_back(cluster);
            continue;
        }
    }
}